

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_throw(lua_State *L,int errcode)

{
  lua_longjmp *plVar1;
  global_State *pgVar2;
  lua_State *plVar3;
  StkId pSVar4;
  long lVar5;
  int errcode_00;
  
  plVar1 = L->errorJmp;
  if (plVar1 != (lua_longjmp *)0x0) {
    plVar1->status = errcode;
    longjmp((__jmp_buf_tag *)plVar1->b,1);
  }
  pgVar2 = L->l_G;
  errcode_00 = luaE_resetthread(L,errcode);
  plVar3 = pgVar2->mainthread;
  if (plVar3->errorJmp == (lua_longjmp *)0x0) {
    if (pgVar2->panic != (lua_CFunction)0x0) {
      (*pgVar2->panic)(L);
    }
    abort();
  }
  pSVar4 = (plVar3->top).p;
  (plVar3->top).p = pSVar4 + 1;
  lVar5 = (L->top).offset;
  (pSVar4->val).value_ = *(Value *)(lVar5 + -0x10);
  (pSVar4->val).tt_ = *(lu_byte *)(lVar5 + -8);
  luaD_throw(pgVar2->mainthread,errcode_00);
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    global_State *g = G(L);
    errcode = luaE_resetthread(L, errcode);  /* close all upvalues */
    if (g->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, g->mainthread->top.p++, L->top.p - 1);  /* copy error obj. */
      luaD_throw(g->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (g->panic) {  /* panic function? */
        lua_unlock(L);
        g->panic(L);  /* call panic function (last chance to jump out) */
      }
      abort();
    }
  }
}